

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

Vec_Vec_t * Abc_DfsLevelized(Abc_Obj_t *pNode,int fTfi)

{
  uint uVar1;
  Vec_Vec_t *vLevels;
  long lVar2;
  
  if (fTfi != 0) {
    __assert_fail("fTfi == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x526,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
  }
  if (pNode->pNtk->ntkType != ABC_NTK_NETLIST) {
    Abc_NtkIncrementTravId(pNode->pNtk);
    vLevels = Vec_VecAlloc(100);
    uVar1 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar1 == 2) || (uVar1 == 5)) {
      Abc_NodeSetTravIdCurrent(pNode);
      for (lVar2 = 0; lVar2 < (pNode->vFanouts).nSize; lVar2 = lVar2 + 1) {
        Abc_DfsLevelizedTfo_rec
                  ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar2]],vLevels)
        ;
      }
    }
    else {
      if (uVar1 != 7) {
        __assert_fail("Abc_ObjIsCi(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                      ,0x52f,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
      }
      Abc_DfsLevelizedTfo_rec(pNode,vLevels);
    }
    return vLevels;
  }
  __assert_fail("!Abc_NtkIsNetlist(pNode->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                ,0x527,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
}

Assistant:

Vec_Vec_t * Abc_DfsLevelized( Abc_Obj_t * pNode, int fTfi )
{
    Vec_Vec_t * vLevels;
    Abc_Obj_t * pFanout;
    int i;
    assert( fTfi == 0 );
    assert( !Abc_NtkIsNetlist(pNode->pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    vLevels = Vec_VecAlloc( 100 );
    if ( Abc_ObjIsNode(pNode) )
        Abc_DfsLevelizedTfo_rec( pNode, vLevels );
    else
    {
        assert( Abc_ObjIsCi(pNode) );
        Abc_NodeSetTravIdCurrent( pNode );
        Abc_ObjForEachFanout( pNode, pFanout, i )
            Abc_DfsLevelizedTfo_rec( pFanout, vLevels );
    }
    return vLevels;
}